

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O3

AggregateFunctionSet * duckdb::MaxFun::GetFunctions(void)

{
  vector<duckdb::AggregateFunction,_true> *this;
  AggregateFunctionSet *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_319;
  LogicalType local_318;
  LogicalType local_300;
  vector<duckdb::LogicalType,_true> local_2e8;
  string local_2d0;
  LogicalType local_2b0 [2];
  AggregateFunction local_280;
  AggregateFunction local_150;
  
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"max","");
  AggregateFunctionSet::AggregateFunctionSet(in_RDI,&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p);
  }
  MaxFunction::GetFunction();
  this = &(in_RDI->super_FunctionSet<duckdb::AggregateFunction>).functions;
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&this->
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_150);
  local_150.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_02435ff8;
  if (local_150.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_150.function_info.internal.
               super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_150.super_BaseScalarFunction);
  LogicalType::LogicalType(local_2b0,ANY);
  LogicalType::LogicalType(local_2b0 + 1,BIGINT);
  __l._M_len = 2;
  __l._M_array = local_2b0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_2e8,__l,
             &local_319);
  LogicalType::LogicalType(&local_318,ANY);
  LogicalType::LIST(&local_300,&local_318);
  AggregateFunction::AggregateFunction
            (&local_280,&local_2e8,&local_300,(aggregate_size_t)0x0,(aggregate_initialize_t)0x0,
             (aggregate_update_t)0x0,(aggregate_combine_t)0x0,(aggregate_finalize_t)0x0,
             (aggregate_simple_update_t)0x0,MinMaxNBind<duckdb::GreaterThan>,
             (aggregate_destructor_t)0x0,(aggregate_statistics_t)0x0,(aggregate_window_t)0x0,
             (aggregate_serialize_t)0x0,(aggregate_deserialize_t)0x0);
  LogicalType::~LogicalType(&local_300);
  LogicalType::~LogicalType(&local_318);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_2e8);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_2b0[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&this->
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_280);
  local_280.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_02435ff8;
  if (local_280.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_280.function_info.internal.
               super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_280.super_BaseScalarFunction);
  return in_RDI;
}

Assistant:

AggregateFunctionSet MaxFun::GetFunctions() {
	AggregateFunctionSet max("max");
	max.AddFunction(MaxFunction::GetFunction());
	max.AddFunction(GetMinMaxNFunction<GreaterThan>());
	return max;
}